

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O3

vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_> *
libcellml::multiRootXml
          (vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
           *__return_storage_ptr__,string *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  XmlDoc *pXVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  XmlDoc *pXVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  XmlDoc *pXVar11;
  ulong uVar12;
  XmlDoc *pXVar13;
  long lVar14;
  string childContent;
  XmlNodePtr child;
  XmlDocPtr doc;
  XmlDocPtr childDoc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> wrappedContent;
  XmlNodePtr rootNode;
  undefined1 local_f9;
  string local_f8;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  *local_d0;
  XmlNode local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  XmlDoc *local_b8;
  ulong local_b0;
  XmlDoc local_a8;
  undefined8 uStack_a0;
  XmlDoc *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  XmlDoc local_88;
  undefined8 uStack_80;
  value_type local_78;
  string local_68;
  string *local_48;
  XmlDoc local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = &local_a8;
  pcVar2 = (content->_M_dataplus)._M_p;
  local_48 = content;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + content->_M_string_length);
  pXVar3 = local_b8;
  pXVar11 = (XmlDoc *)((long)&local_b8->mPimpl + local_b0);
  pXVar9 = local_b8;
  if (0 < (long)local_b0 >> 2) {
    pXVar9 = (XmlDoc *)((long)&local_b8->mPimpl + (local_b0 & 0xfffffffffffffffc));
    lVar14 = ((long)local_b0 >> 2) + 1;
    pXVar13 = (XmlDoc *)((long)&local_b8->mPimpl + 3);
    do {
      iVar5 = isspace((int)*(char *)((long)&pXVar13[-1].mPimpl + 5));
      if (iVar5 == 0) {
        pXVar13 = (XmlDoc *)((long)&pXVar13[-1].mPimpl + 5);
        goto LAB_0028ccf8;
      }
      iVar5 = isspace((int)*(char *)((long)&pXVar13[-1].mPimpl + 6));
      if (iVar5 == 0) {
        pXVar13 = (XmlDoc *)((long)&pXVar13[-1].mPimpl + 6);
        goto LAB_0028ccf8;
      }
      iVar5 = isspace((int)*(char *)((long)&pXVar13[-1].mPimpl + 7));
      if (iVar5 == 0) {
        pXVar13 = (XmlDoc *)((long)&pXVar13[-1].mPimpl + 7);
        goto LAB_0028ccf8;
      }
      iVar5 = isspace((int)*(char *)&pXVar13->mPimpl);
      if (iVar5 == 0) goto LAB_0028ccf8;
      lVar14 = lVar14 + -1;
      pXVar13 = (XmlDoc *)((long)&pXVar13->mPimpl + 4);
    } while (1 < lVar14);
  }
  lVar14 = (long)pXVar11 - (long)pXVar9;
  if (lVar14 == 1) {
LAB_0028ccd4:
    iVar5 = isspace((int)*(char *)&pXVar9->mPimpl);
    pXVar13 = pXVar9;
    if (iVar5 != 0) {
      pXVar13 = pXVar11;
    }
LAB_0028ccf8:
    if (pXVar11 == pXVar13) goto LAB_0028cd11;
    std::__cxx11::string::_M_erase((ulong)&local_b8,0);
  }
  else {
    if (lVar14 == 2) {
LAB_0028ccc3:
      iVar5 = isspace((int)*(char *)&pXVar9->mPimpl);
      pXVar13 = pXVar9;
      if (iVar5 != 0) {
        pXVar9 = (XmlDoc *)((long)&pXVar9->mPimpl + 1);
        goto LAB_0028ccd4;
      }
      goto LAB_0028ccf8;
    }
    if (lVar14 == 3) {
      iVar5 = isspace((int)*(char *)&pXVar9->mPimpl);
      pXVar13 = pXVar9;
      if (iVar5 != 0) {
        pXVar9 = (XmlDoc *)((long)&pXVar9->mPimpl + 1);
        goto LAB_0028ccc3;
      }
      goto LAB_0028ccf8;
    }
LAB_0028cd11:
    local_b0 = 0;
    *(undefined1 *)&pXVar3->mPimpl = 0;
  }
  pXVar3 = local_b8;
  pXVar11 = (XmlDoc *)((long)&local_b8->mPimpl + local_b0);
  lVar14 = (long)local_b0 >> 2;
  pXVar9 = pXVar11;
  if (0 < lVar14) {
    pXVar9 = (XmlDoc *)((long)pXVar11 - (local_b0 & 0xfffffffffffffffc));
    pXVar11 = (XmlDoc *)((long)pXVar11 + lVar14 * -4);
    lVar14 = lVar14 + 1;
    uVar12 = local_b0;
    local_d0 = __return_storage_ptr__;
    do {
      iVar5 = isspace((int)*(char *)((long)pXVar3 + (uVar12 - 1)));
      if (iVar5 == 0) {
        __return_storage_ptr__ = local_d0;
        pXVar13 = (XmlDoc *)((long)&pXVar3->mPimpl + uVar12);
        goto LAB_0028ce43;
      }
      iVar5 = isspace((int)*(char *)((long)pXVar3 + (uVar12 - 2)));
      if (iVar5 == 0) {
        __return_storage_ptr__ = local_d0;
        pXVar13 = (XmlDoc *)((long)pXVar3 + (uVar12 - 1));
        goto LAB_0028ce43;
      }
      iVar5 = isspace((int)*(char *)((long)pXVar3 + (uVar12 - 3)));
      if (iVar5 == 0) {
        __return_storage_ptr__ = local_d0;
        pXVar13 = (XmlDoc *)((long)pXVar3 + (uVar12 - 2));
        goto LAB_0028ce43;
      }
      iVar5 = isspace((int)*(char *)((long)pXVar3 + (uVar12 - 4)));
      __return_storage_ptr__ = local_d0;
      if (iVar5 == 0) {
        pXVar13 = (XmlDoc *)((long)pXVar3 + (uVar12 - 3));
        goto LAB_0028ce43;
      }
      uVar12 = uVar12 - 4;
      lVar14 = lVar14 + -1;
    } while (1 < lVar14);
  }
  lVar14 = (long)pXVar9 - (long)pXVar3;
  if (lVar14 != 1) {
    if (lVar14 != 2) {
      pXVar13 = pXVar3;
      if ((lVar14 != 3) ||
         (iVar5 = isspace((int)*(char *)((long)&pXVar9[-1].mPimpl + 7)), pXVar13 = pXVar9,
         iVar5 == 0)) goto LAB_0028ce43;
      pXVar9 = (XmlDoc *)((long)&pXVar11[-1].mPimpl + 7);
      pXVar11 = pXVar9;
    }
    iVar5 = isspace((int)*(char *)((long)&pXVar9[-1].mPimpl + 7));
    pXVar13 = pXVar9;
    if (iVar5 == 0) goto LAB_0028ce43;
    pXVar9 = (XmlDoc *)((long)&pXVar11[-1].mPimpl + 7);
  }
  iVar5 = isspace((int)*(char *)((long)&pXVar9[-1].mPimpl + 7));
  pXVar13 = pXVar9;
  if (iVar5 != 0) {
    pXVar13 = pXVar3;
  }
LAB_0028ce43:
  *(undefined1 *)&pXVar13->mPimpl = 0;
  if (local_b8 == &local_a8) {
    uStack_80 = uStack_a0;
    local_98 = &local_88;
  }
  else {
    local_98 = local_b8;
  }
  local_88.mPimpl._1_7_ = local_a8.mPimpl._1_7_;
  local_88.mPimpl._0_1_ = local_a8.mPimpl._0_1_;
  local_b0 = 0;
  local_a8.mPimpl._0_1_ = 0;
  local_b8 = &local_a8;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pXVar13 - (long)pXVar3);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2a9883);
  paVar1 = &local_f8.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar7) {
    local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_f8.field_2._8_8_ = plVar6[3];
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_f8._M_string_length = plVar6[1];
  *plVar6 = (long)paVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_68.field_2._M_allocated_capacity = *psVar8;
    local_68.field_2._8_8_ = plVar6[3];
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar8;
    local_68._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_68._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)((long)&(local_88.mPimpl)->mXmlDocPtr + 1));
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8.mPimpl._1_7_,local_a8.mPimpl._0_1_) + 1);
  }
  local_98 = (XmlDoc *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libcellml::XmlDoc,std::allocator<libcellml::XmlDoc>>
            (&local_90,&local_98,(allocator<libcellml::XmlDoc> *)&local_f8);
  XmlDoc::parse(local_98,&local_68);
  XmlDoc::rootNode(&local_40);
  if (local_40.mPimpl == (XmlDocImpl *)0x0) {
    local_f8._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlDoc,std::allocator<libcellml::XmlDoc>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length,
               (XmlDoc **)&local_f8,(allocator<libcellml::XmlDoc> *)&local_c8);
    XmlDoc::parse((XmlDoc *)local_f8._M_dataplus._M_p,local_48);
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_f8);
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
  }
  else {
    XmlNode::firstChild(&local_c8);
    p_Var10 = local_c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.mPimpl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      do {
        bVar4 = XmlNode::isElement((XmlNode *)local_c8.mPimpl);
        if (bVar4) {
          XmlNode::convertToString_abi_cxx11_(&local_f8,(XmlNode *)local_c8.mPimpl);
          local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (XmlDoc *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<libcellml::XmlDoc,std::allocator<libcellml::XmlDoc>>
                    (&local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(XmlDoc **)&local_78,(allocator<libcellml::XmlDoc> *)&local_f9);
          XmlDoc::parse(local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&local_f8);
          std::
          vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
          ::push_back(__return_storage_ptr__,&local_78);
          if (local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super___shared_ptr<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar1) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        XmlNode::next((XmlNode *)&local_f8);
        p_Var10 = local_c0;
        local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
        local_c8.mPimpl = (XmlNodeImpl *)local_f8._M_dataplus._M_p;
        local_f8._M_dataplus._M_p = (pointer)0x0;
        local_f8._M_string_length = 0;
        if ((p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
        }
        p_Var10 = local_c0;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8.mPimpl !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0);
    }
  }
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XmlDocPtr> multiRootXml(const std::string &content)
{
    std::vector<XmlDocPtr> childDocs;

    // Wrap potentially multiple nodes in our own root node.
    auto wrappedContent = "<root>" + trimCopy(content) + "</root>";

    // Parse this new string as a document and turn the child nodes
    // into their own document.
    XmlDocPtr doc = std::make_shared<XmlDoc>();
    doc->parse(wrappedContent);
    XmlNodePtr rootNode = doc->rootNode();
    if (rootNode != nullptr) {
        XmlNodePtr child = rootNode->firstChild();
        while (child != nullptr) {
            if (child->isElement()) {
                auto childContent = child->convertToString();
                XmlDocPtr childDoc = std::make_shared<XmlDoc>();
                childDoc->parse(childContent);
                childDocs.push_back(childDoc);
            }
            child = child->next();
        }
    } else {
        XmlDocPtr originalContentDoc = std::make_shared<XmlDoc>();
        originalContentDoc->parse(content);
        childDocs.push_back(originalContentDoc);
    }

    return childDocs;
}